

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O0

void ddDissolveGroup(DdManager *table,int x,int y)

{
  uint uVar1;
  uint local_20;
  int boty;
  int topx;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  for (local_20 = y; local_20 < table->subtables[(int)local_20].next;
      local_20 = table->subtables[(int)local_20].next) {
  }
  uVar1 = table->subtables[(int)local_20].next;
  table->subtables[(int)local_20].next = y;
  table->subtables[x].next = uVar1;
  return;
}

Assistant:

static void
ddDissolveGroup(
  DdManager * table,
  int  x,
  int  y)
{
    int topx;
    int boty;

    /* find top and bottom of the two groups */
    boty = y;
    while ((unsigned) boty < table->subtables[boty].next)
        boty = table->subtables[boty].next;

    topx = table->subtables[boty].next;

    table->subtables[boty].next = y;
    table->subtables[x].next = topx;

    return;

}